

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O1

Sexp * __thiscall Activation::Get(Activation *this,size_t up_index,size_t right_index)

{
  pointer ppSVar1;
  Sexp *pSVar2;
  undefined8 *puVar3;
  uint *local_70;
  undefined8 local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  ContractFrameProtector local_30;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_30,"Get");
  ContractFrame::AddContract(local_30.protected_frame,NoGc);
  if (up_index != 0) {
    do {
      if (this == (Activation *)0x0) {
        __assert_fail("cursor != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x22,"Sexp *Activation::Get(size_t, size_t)");
      }
      if (this->parent->kind != ACTIVATION) {
        __assert_fail("cursor->parent->IsActivation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x23,"Sexp *Activation::Get(size_t, size_t)");
      }
      this = (this->parent->field_1).activation;
      up_index = up_index - 1;
    } while (up_index != 0);
  }
  if (this == (Activation *)0x0) {
    __assert_fail("cursor != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                  ,0x27,"Sexp *Activation::Get(size_t, size_t)");
  }
  ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (right_index <
      (ulong)((long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3)) {
    pSVar2 = ppSVar1[right_index];
    if (pSVar2 != (Sexp *)0x0) {
      ContractFrameProtector::~ContractFrameProtector(&local_30);
      return pSVar2;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "invalid read of uninitialized variable. Run with --warnings for more details.","");
    *puVar3 = &PTR__JetRuntimeException_00126918;
    puVar3[1] = puVar3 + 3;
    if (local_50 == &local_40) {
      *(uint *)(puVar3 + 3) = local_40;
      *(undefined4 *)((long)puVar3 + 0x1c) = uStack_3c;
      *(undefined4 *)(puVar3 + 4) = uStack_38;
      *(undefined4 *)((long)puVar3 + 0x24) = uStack_34;
    }
    else {
      puVar3[1] = local_50;
      puVar3[3] = CONCAT44(uStack_3c,local_40);
    }
    puVar3[2] = local_48;
    local_48 = 0;
    local_40 = local_40 & 0xffffff00;
    local_50 = &local_40;
    __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "invalid read of uninitialized variable. Run with --warnings for more details.","");
  *puVar3 = &PTR__JetRuntimeException_00126918;
  puVar3[1] = puVar3 + 3;
  if (local_70 == &local_60) {
    *(uint *)(puVar3 + 3) = local_60;
    *(undefined4 *)((long)puVar3 + 0x1c) = uStack_5c;
    *(undefined4 *)(puVar3 + 4) = uStack_58;
    *(undefined4 *)((long)puVar3 + 0x24) = uStack_54;
  }
  else {
    puVar3[1] = local_70;
    puVar3[3] = CONCAT44(uStack_5c,local_60);
  }
  puVar3[2] = local_68;
  local_68 = 0;
  local_60 = local_60 & 0xffffff00;
  local_70 = &local_60;
  __cxa_throw(puVar3,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Activation::Get(size_t up_index, size_t right_index) {
  CONTRACT { FORBID_GC; }